

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

size_t really_read(int sock,void *in,size_t count)

{
  uint uVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  ostream *poVar6;
  vw_exception *this;
  ulong uVar7;
  char *__buf;
  string local_2d0;
  stringstream __msg;
  ostream local_2a0;
  char __errmsg [256];
  
  uVar7 = 0;
  while( true ) {
    if (count <= uVar7) {
      return uVar7;
    }
    sVar2 = read(sock,in,(ulong)(uint)((int)count - (int)uVar7));
    uVar1 = (uint)sVar2;
    if (uVar1 == 0) break;
    if ((int)uVar1 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar6 = &local_2a0;
      poVar3 = std::operator<<(poVar6,"read(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sock);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"-");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,")");
      piVar4 = __errno_location();
      __buf = __errmsg;
      pcVar5 = strerror_r(*piVar4,__buf,0x100);
      if (pcVar5 == (char *)0x0) {
        poVar6 = std::operator<<(poVar6,"errno = ");
      }
      else {
        __buf = "errno = unknown";
      }
      std::operator<<(poVar6,__buf);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
                 ,0x2b,&local_2d0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar7 = uVar7 + (uVar1 & 0x7fffffff);
    in = (void *)((long)in + (ulong)(uVar1 & 0x7fffffff));
  }
  return 0;
}

Assistant:

size_t really_read(int sock, void* in, size_t count)
{
  char* buf = (char*)in;
  size_t done = 0;
  int r = 0;
  while (done < count)
  {
    if ((r =
#ifdef _WIN32
                recv(sock, buf, (unsigned int)(count - done), 0)
#else
                read(sock, buf, (unsigned int)(count - done))
#endif
                ) == 0)
      return 0;
    else if (r < 0)
    {
      THROWERRNO("read(" << sock << "," << count << "-" << done << ")");
    }
    else
    {
      done += r;
      buf += r;
    }
  }
  return done;
}